

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  ImDrawVert *pIVar2;
  long lVar3;
  ImDrawIdx IVar4;
  long lVar5;
  ImDrawIdx IVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined4 in_register_00000014;
  ImDrawIdx *pIVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ImDrawIdx IVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  undefined1 local_58 [16];
  uint *local_48;
  uint local_3c;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000014,points_count);
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      local_3c = (uint)local_38;
      uVar9 = 0;
      do {
        this->_VtxWritePtr->pos = points[uVar9];
        this->_VtxWritePtr->uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2->col = col;
        this->_VtxWritePtr = pIVar2 + 1;
        uVar9 = uVar9 + 1;
      } while ((local_38 & 0xffffffff) != uVar9);
      uVar15 = this->_VtxCurrentIdx;
      uVar7 = 3;
      if (3 < (int)local_3c) {
        uVar7 = local_3c;
      }
      pIVar10 = this->_IdxWritePtr;
      iVar8 = uVar7 - 2;
      iVar11 = uVar15 + 2;
      do {
        *pIVar10 = (ImDrawIdx)uVar15;
        pIVar10[1] = (ImDrawIdx)iVar11 - 1;
        pIVar10[2] = (ImDrawIdx)iVar11;
        pIVar10 = pIVar10 + 3;
        iVar11 = iVar11 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      this->_IdxWritePtr = pIVar10;
      local_3c = local_3c & 0xffff;
      local_48 = &this->_VtxCurrentIdx;
    }
    else {
      local_58 = ZEXT416((uint)this->_FringeScale);
      local_3c = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_3c);
      local_48 = &this->_VtxCurrentIdx;
      uVar15 = this->_VtxCurrentIdx;
      IVar4 = (ImDrawIdx)uVar15;
      pIVar10 = this->_IdxWritePtr;
      iVar11 = (int)local_38;
      iVar12 = iVar11 + -2;
      iVar8 = uVar15 + 2;
      do {
        *pIVar10 = IVar4;
        pIVar10[1] = (ImDrawIdx)iVar8;
        iVar8 = iVar8 + 2;
        pIVar10[2] = (ImDrawIdx)iVar8;
        pIVar10 = pIVar10 + 3;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      this->_IdxWritePtr = pIVar10;
      lVar3 = -((local_38 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0);
      lVar5 = lVar3 + -0x58;
      iVar8 = iVar11 + -1;
      uVar9 = 1;
      if (1 < iVar11) {
        uVar9 = local_38 & 0xffffffff;
      }
      uVar13 = 0;
      iVar11 = iVar8;
      do {
        lVar16 = (long)iVar11;
        fVar17 = points[uVar13].x - points[lVar16].x;
        fVar18 = points[uVar13].y - points[lVar16].y;
        auVar19._0_4_ = fVar17 * fVar17 + fVar18 * fVar18;
        auVar19._4_4_ = fVar18;
        auVar19._8_8_ = 0;
        if (0.0 < auVar19._0_4_) {
          auVar19 = rsqrtss(auVar19,auVar19);
          fVar17 = fVar17 * auVar19._0_4_;
          fVar18 = fVar18 * auVar19._0_4_;
        }
        *(float *)(local_58 + lVar16 * 8 + lVar5 + 0x58) = fVar18;
        *(float *)(local_58 + lVar16 * 8 + lVar3 + 4) = -fVar17;
        iVar11 = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
      uVar9 = 1;
      if (1 < (int)local_38) {
        uVar9 = local_38 & 0xffffffff;
      }
      uVar13 = 0;
      do {
        fVar17 = ((float)*(undefined8 *)(local_58 + uVar13 * 8 + lVar5 + 0x58) +
                 (float)*(undefined8 *)(local_58 + (long)iVar8 * 8 + lVar5 + 0x58)) * 0.5;
        fVar18 = ((float)((ulong)*(undefined8 *)(local_58 + uVar13 * 8 + lVar5 + 0x58) >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_58 + (long)iVar8 * 8 + lVar5 + 0x58) >> 0x20))
                 * 0.5;
        fVar20 = fVar17 * fVar17 + fVar18 * fVar18;
        if (1e-06 < fVar20) {
          fVar20 = 1.0 / fVar20;
          fVar21 = 100.0;
          if (fVar20 <= 100.0) {
            fVar21 = fVar20;
          }
          fVar17 = fVar17 * fVar21;
          fVar18 = fVar18 * fVar21;
        }
        fVar17 = fVar17 * (float)local_58._0_4_ * 0.5;
        fVar18 = fVar18 * (float)local_58._0_4_ * 0.5;
        pIVar2 = this->_VtxWritePtr;
        IVar22.x = points[uVar13].x - fVar17;
        IVar22.y = points[uVar13].y - fVar18;
        pIVar2->pos = IVar22;
        pIVar2->uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2->col = col;
        IVar23.x = points[uVar13].x + fVar17;
        IVar23.y = points[uVar13].y + fVar18;
        pIVar2[1].pos = IVar23;
        pIVar2[1].uv = IVar1;
        pIVar2 = this->_VtxWritePtr;
        pIVar2[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar2 + 2;
        pIVar10 = this->_IdxWritePtr;
        IVar14 = (ImDrawIdx)uVar15;
        *pIVar10 = IVar14;
        pIVar10[1] = IVar4 + (short)iVar8 * 2;
        IVar6 = IVar4 + 1 + (short)iVar8 * 2;
        pIVar10[2] = IVar6;
        pIVar10[3] = IVar6;
        pIVar10[4] = IVar14 + 1;
        pIVar10[5] = IVar14;
        this->_IdxWritePtr = pIVar10 + 6;
        iVar8 = (int)uVar13;
        uVar13 = uVar13 + 1;
        uVar15 = uVar15 + 2;
      } while (uVar9 != uVar13);
      local_3c = local_3c & 0xfffe;
    }
    *local_48 = *local_48 + local_3c;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}